

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_ObjAddFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  
  if (pObj->nFanins != 0) {
    __assert_fail("pObj->nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xf1,"void Wlc_ObjAddFanins(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *)");
  }
  uVar5 = vFanins->nSize;
  pObj->nFanins = uVar5;
  uVar1 = *(ushort *)pObj & 0x3f;
  if (uVar1 == 6) {
    uVar2 = 0;
  }
  else {
    if ((uVar1 != 0x35) && (uVar1 != 0x16)) goto LAB_002eb05b;
    uVar2 = 1;
  }
  pObj->nFanins = uVar2;
LAB_002eb05b:
  iVar3 = Wlc_ObjHasArray(pObj);
  if (iVar3 != 0) {
    piVar4 = (int *)Mem_FlexEntryFetch(p->pMemFanin,uVar5 << 2);
    (pObj->field_10).pFanins[0] = piVar4;
    uVar5 = vFanins->nSize;
  }
  piVar4 = Wlc_ObjFanins(pObj);
  memcpy(piVar4,vFanins->pArray,(long)(int)uVar5 << 2);
  return;
}

Assistant:

void Wlc_ObjAddFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFanins )
{
    assert( pObj->nFanins == 0 );
    pObj->nFanins = Vec_IntSize(vFanins);
    // special treatment of CONST, SELECT and TABLE
    if ( pObj->Type == WLC_OBJ_CONST )
        pObj->nFanins = 0;
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
        pObj->nFanins = 1;
    if ( Wlc_ObjHasArray(pObj) )
        pObj->pFanins[0] = (int *)Mem_FlexEntryFetch( p->pMemFanin, Vec_IntSize(vFanins) * sizeof(int) );
    memcpy( Wlc_ObjFanins(pObj), Vec_IntArray(vFanins), sizeof(int) * Vec_IntSize(vFanins) );
}